

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  Vec_Int_t *p_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar4;
  int *piVar5;
  Wlc_Ntk_t *pWVar6;
  int iVar7;
  long lVar8;
  
  p_01 = vNodesInit;
  if ((vNodesInit == (Vec_Int_t *)0x0) &&
     (p_01 = Wlc_NtkCollectMultipliers(p), p_01 == (Vec_Int_t *)0x0)) {
    return (Wlc_Ntk_t *)0x0;
  }
  for (iVar7 = 0; iVar7 < p_01->nSize; iVar7 = iVar7 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar7);
    pWVar4 = Wlc_NtkObj(p,iVar2);
    *(byte *)pWVar4 = *(byte *)pWVar4 | 0x80;
  }
  p_00 = &p->vCopies;
  Vec_IntFill(p_00,p->nObjsAlloc,0);
  for (iVar7 = 1; (iVar7 < p->iObj && (pWVar4 = Wlc_NtkObj(p,iVar7), iVar7 != (p->vCopies).nSize));
      iVar7 = iVar7 + 1) {
    uVar1 = *(ushort *)pWVar4;
    if ((char)uVar1 < '\0') {
      *(ushort *)pWVar4 = uVar1 & 0xff7f;
      iVar3 = pWVar4->End - pWVar4->Beg;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      iVar2 = Wlc_ObjAlloc(p,1,uVar1 >> 6 & 1,iVar2,0);
    }
    else {
      for (lVar8 = 0; iVar2 = iVar7, lVar8 < (int)pWVar4->nFanins; lVar8 = lVar8 + 1) {
        iVar2 = Wlc_ObjFaninId(pWVar4,(int)lVar8);
        iVar2 = Vec_IntEntry(p_00,iVar2);
        piVar5 = Wlc_ObjFanins(pWVar4);
        piVar5[lVar8] = iVar2;
      }
    }
    Vec_IntWriteEntry(p_00,iVar7,iVar2);
  }
  if (p_01 != vNodesInit) {
    Vec_IntFree(p_01);
  }
  pWVar6 = Wlc_NtkDupDfs(p,0,1);
  return pWVar6;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}